

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGenInitializer::GetMocBuildPath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenInitializer *this,MUFile *muf)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  string *psVar5;
  char *pcVar6;
  unsigned_long val;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view filename;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  string basePath;
  undefined1 local_118 [48];
  string local_e8;
  string local_c8;
  MUFile *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  pointer pcStack_68;
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (muf->MocIt == true) {
    pcVar6 = (char *)0xa;
    cmFilePathChecksum::getPart((string *)local_118,&this->PathCheckSum,&muf->FullPath,10);
    uVar2 = local_118._8_8_;
    uVar1 = local_118._0_8_;
    filename._M_str = pcVar6;
    filename._M_len = (size_t)(muf->FullPath)._M_dataplus._M_p;
    cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
              (&local_c8,(cmQtAutoGen *)(muf->FullPath)._M_string_length,filename);
    local_90._M_len = uVar2;
    local_90._M_str = (char *)uVar1;
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5;
    paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x68e014;
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_string_length;
    pcStack_68 = local_c8._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_90;
    cmCatViews_abi_cxx11_(&local_e8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,CONCAT71(local_118._17_7_,local_118[0x10]) + 1);
    }
    local_90._M_len = local_e8._M_string_length;
    local_90._M_str = local_e8._M_dataplus._M_p;
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
    paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x6e078a;
    views_00._M_len = 2;
    views_00._M_array = &local_90;
    cmCatViews_abi_cxx11_((string *)local_118,views_00);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_118);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,CONCAT71(local_118._17_7_,local_118[0x10]) + 1);
    }
    puVar7 = &(this->Moc).EmittedBuildPaths;
    pVar8 = std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)puVar7,__return_storage_ptr__);
    sVar4 = local_e8._M_string_length;
    _Var3._M_p = local_e8._M_dataplus._M_p;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_118._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_118._8_8_ = local_118 + 0x10;
      local_118[0x10] = '_';
      psVar5 = cmSourceFile::GetExtension_abi_cxx11_(muf->SF);
      local_90._M_len = sVar4;
      local_90._M_str = _Var3._M_p;
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_118._0_8_;
      paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_118._8_8_;
      pcStack_68 = (psVar5->_M_dataplus)._M_p;
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)psVar5->_M_string_length;
      views_01._M_len = 3;
      views_01._M_array = &local_90;
      cmCatViews_abi_cxx11_(&local_c8,views_01);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      local_90._M_len = local_e8._M_string_length;
      local_90._M_str = local_e8._M_dataplus._M_p;
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x4;
      paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x6e078a;
      views_02._M_len = 2;
      views_02._M_array = &local_90;
      cmCatViews_abi_cxx11_((string *)local_118,views_02);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,CONCAT71(local_118._17_7_,local_118[0x10]) + 1);
      }
      pVar8 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::__cxx11::string&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)puVar7,__return_storage_ptr__);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        val = 2;
        local_98 = muf;
        do {
          local_c8._M_dataplus._M_p = (pointer)0x1;
          local_c8._M_string_length = (size_type)&local_c8.field_2;
          local_c8.field_2._M_local_buf[0] = '_';
          local_90._M_len = local_e8._M_string_length;
          local_90._M_str = local_e8._M_dataplus._M_p;
          local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1;
          paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_c8._M_string_length;
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_118,val);
          local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_118._0_8_;
          pcStack_68 = (pointer)local_118._8_8_;
          local_60 = 4;
          local_58 = ".cpp";
          views_03._M_len = 4;
          views_03._M_array = &local_90;
          cmCatViews_abi_cxx11_(&local_50,views_03);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pVar8 = std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::_M_emplace<std::__cxx11::string&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)puVar7,__return_storage_ptr__);
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_00438ed3;
          val = val + 1;
        } while (val != 0x100);
        paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_98->FullPath)._M_dataplus._M_p;
        local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_98->FullPath)._M_string_length;
        local_90._M_len = 0x22;
        local_90._M_str = "moc output file name conflict for ";
        views_04._M_len = 2;
        views_04._M_array = &local_90;
        cmCatViews_abi_cxx11_((string *)local_118,views_04);
        cmSystemTools::Error((string *)local_118);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,CONCAT71(local_118._17_7_,local_118[0x10]) + 1);
        }
      }
    }
LAB_00438ed3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::GetMocBuildPath(MUFile const& muf)
{
  std::string res;
  if (!muf.MocIt) {
    return res;
  }

  std::string basePath =
    cmStrCat(this->PathCheckSum.getPart(muf.FullPath), "/moc_",
             FileNameWithoutLastExtension(muf.FullPath));

  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name already emitted.
  // Try appending the header suffix to the base path.
  basePath = cmStrCat(basePath, '_', muf.SF->GetExtension());
  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name with header extension already emitted.
  // Try adding a number to the base path.
  constexpr std::size_t number_begin = 2;
  constexpr std::size_t number_end = 256;
  for (std::size_t ii = number_begin; ii != number_end; ++ii) {
    res = cmStrCat(basePath, '_', ii, ".cpp");
    if (this->Moc.EmittedBuildPaths.emplace(res).second) {
      return res;
    }
  }

  // Output file name conflict (unlikely, but still...)
  cmSystemTools::Error(
    cmStrCat("moc output file name conflict for ", muf.FullPath));

  return res;
}